

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderError6::getTessellationControlShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError6 *this,uint n_program_object)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  ostream *poVar2;
  GLint gl_max_patch_vertices_value;
  string tc_code_layout_qualifier_string;
  stringstream tc_code_layout_qualifier_sstream;
  stringstream result;
  undefined1 *local_370;
  undefined8 local_368;
  undefined1 local_360 [16];
  string local_350 [32];
  stringstream local_330 [16];
  ostream local_320;
  stringstream local_1a8 [16];
  ostream local_198;
  
  iVar1 = (*((this->super_TessellationShaderErrorsTestCaseBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::stringstream(local_330);
  local_370 = local_360;
  local_368 = 0;
  local_360[0] = 0;
  if (n_program_object == 0) {
    std::__cxx11::string::assign((char *)&local_370);
  }
  else {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))
              ((this->super_TessellationShaderErrorsTestCaseBase).super_TestCaseBase.m_glExtTokens.
               MAX_PATCH_VERTICES);
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderErrors.cpp"
                    ,0x77b);
    poVar2 = std::operator<<(&local_320,"layout (vertices = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::operator<<(poVar2,") out;\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_370,local_350);
    std::__cxx11::string::~string(local_350);
  }
  poVar2 = std::operator<<(&local_198,"${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\n");
  poVar2 = std::operator<<(poVar2,(string *)&local_370);
  std::operator<<(poVar2,
                  "\nin vec4 test_input[];\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = test_input[0];\n    gl_TessLevelOuter[0]                = 1.0;\n    gl_TessLevelOuter[1]                = 1.0;\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::stringstream::~stringstream(local_330);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError6::getTessellationControlShaderCode(unsigned int n_program_object)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	std::stringstream	 result;
	const char*			  tc_code_preamble = "${VERSION}\n"
								   "\n"
								   "${TESSELLATION_SHADER_REQUIRE}\n"
								   "\n";
	const char* tc_code_body_excl_layout_qualifiers = "\n"
													  "in vec4 test_input[];\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "    gl_out[gl_InvocationID].gl_Position = test_input[0];\n"
													  "    gl_TessLevelOuter[0]                = 1.0;\n"
													  "    gl_TessLevelOuter[1]                = 1.0;\n"
													  "}\n";

	/* Prepare the line with layout qualifier */
	std::stringstream tc_code_layout_qualifier_sstream;
	std::string		  tc_code_layout_qualifier_string;

	if (n_program_object == 0)
	{
		tc_code_layout_qualifier_string = "layout (vertices = 0) out;\n";
	}
	else
	{
		/* Retrieve GL_MAX_PATCH_VERTICES_EXT value first */
		glw::GLint gl_max_patch_vertices_value = 0;

		gl.getIntegerv(m_glExtTokens.MAX_PATCH_VERTICES, &gl_max_patch_vertices_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname");

		/* Construct the string */
		tc_code_layout_qualifier_sstream << "layout (vertices = " << (gl_max_patch_vertices_value + 1) << ") out;\n";

		tc_code_layout_qualifier_string = tc_code_layout_qualifier_sstream.str();
	}

	result << tc_code_preamble << tc_code_layout_qualifier_string << tc_code_body_excl_layout_qualifiers;

	return result.str();
}